

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteStmt.cpp
# Opt level: O3

bool __thiscall hiberlite::SQLiteSelect::step(SQLiteSelect *this)

{
  int *piVar1;
  int result;
  database_error *this_00;
  shared_connection local_20;
  
  result = sqlite3_step(((this->statement).res)->res->obj);
  if (result != 0x65) {
    if (result != 100) {
      local_20._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      local_20.res = (this->con).res;
      if (local_20.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_20.res)->refCount = (local_20.res)->refCount + 1;
      }
      database_error::database_assert(result,&local_20);
      local_20._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      if (local_20.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_20.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_20.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      this_00 = (database_error *)__cxa_allocate_exception(0x10);
      database_error::database_error(this_00,"really strange - sqlite3_step returns SQLITE_OK");
      __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->active = true;
  }
  return result != 0x65;
}

Assistant:

bool SQLiteSelect::step()
{
	int rc=sqlite3_step(statement->get_stmt());
	if(rc==SQLITE_DONE)
		return false;
	if(rc==SQLITE_ROW){
		active=true;
		return true;
	}
	database_error::database_assert(rc, con);
	throw database_error("really strange - sqlite3_step returns SQLITE_OK");
}